

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_catalog_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::SchemaCatalogEntry::GetInfo(SchemaCatalogEntry *this)

{
  pointer pCVar1;
  long in_RSI;
  unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true> local_20
  ;
  
  make_uniq<duckdb::CreateSchemaInfo>();
  pCVar1 = unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
           ::operator->(&local_20);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar1->super_CreateInfo).schema);
  pCVar1 = unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
           ::operator->(&local_20);
  Value::operator=(&(pCVar1->super_CreateInfo).comment,(Value *)(in_RSI + 0x50));
  pCVar1 = unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
           ::operator->(&local_20);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(pCVar1->super_CreateInfo).tags,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(in_RSI + 0x90));
  (this->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry =
       (_func_int **)
       local_20.
       super_unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateSchemaInfo_*,_std::default_delete<duckdb::CreateSchemaInfo>_>
       .super__Head_base<0UL,_duckdb::CreateSchemaInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> SchemaCatalogEntry::GetInfo() const {
	auto result = make_uniq<CreateSchemaInfo>();
	result->schema = name;
	result->comment = comment;
	result->tags = tags;
	return std::move(result);
}